

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnReloc
          (BinaryReaderObjdump *this,RelocType type,Offset offset,Index index,uint32_t addend)

{
  uint32_t uVar1;
  uint uVar2;
  Offset OVar3;
  char *pcVar4;
  size_type sVar5;
  const_pointer pcVar6;
  uint32_t local_5c;
  undefined1 auStack_58 [4];
  int32_t signed_addend;
  string_view local_48;
  long local_38;
  Offset total_offset;
  uint32_t addend_local;
  Index index_local;
  Offset offset_local;
  BinaryReaderObjdump *pBStack_18;
  RelocType type_local;
  BinaryReaderObjdump *this_local;
  
  total_offset._0_4_ = addend;
  total_offset._4_4_ = index;
  _addend_local = offset;
  offset_local._4_4_ = type;
  pBStack_18 = this;
  OVar3 = BinaryReaderObjdumpBase::GetSectionStart
                    (&this->super_BinaryReaderObjdumpBase,
                     (this->super_BinaryReaderObjdumpBase).reloc_section_);
  local_38 = OVar3 + _addend_local;
  pcVar4 = GetRelocTypeName(offset_local._4_4_);
  PrintDetails(this,"   - %-18s offset=%#08zx(file=%#08zx) ",pcVar4,_addend_local,local_38);
  uVar2 = total_offset._4_4_;
  if (offset_local._4_4_ == TypeIndexLEB) {
    PrintDetails(this,"type=%u",(ulong)total_offset._4_4_);
  }
  else {
    local_48 = BinaryReaderObjdumpBase::GetSymbolName
                         (&this->super_BinaryReaderObjdumpBase,total_offset._4_4_);
    sVar5 = string_view::length(&local_48);
    _auStack_58 = BinaryReaderObjdumpBase::GetSymbolName
                            (&this->super_BinaryReaderObjdumpBase,total_offset._4_4_);
    pcVar6 = string_view::data((string_view *)auStack_58);
    PrintDetails(this,"symbol=%u <%.*s>",(ulong)uVar2,sVar5 & 0xffffffff,pcVar6);
  }
  uVar1 = (uint32_t)total_offset;
  if ((uint32_t)total_offset != 0) {
    local_5c = (uint32_t)total_offset;
    if ((int)(uint32_t)total_offset < 0) {
      PrintDetails(this,"-");
      local_5c = -uVar1;
    }
    else {
      PrintDetails(this,"+");
    }
    PrintDetails(this,"%#x",(ulong)local_5c);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnReloc(RelocType type,
                                    Offset offset,
                                    Index index,
                                    uint32_t addend) {
  Offset total_offset = GetSectionStart(reloc_section_) + offset;
  PrintDetails("   - %-18s offset=%#08" PRIoffset "(file=%#08" PRIoffset ") ",
               GetRelocTypeName(type), offset, total_offset);
  if (type == RelocType::TypeIndexLEB) {
    PrintDetails("type=%" PRIindex, index);
  } else {
    PrintDetails("symbol=%" PRIindex " <" PRIstringview ">", index,
                 WABT_PRINTF_STRING_VIEW_ARG(GetSymbolName(index)));
  }

  if (addend) {
    int32_t signed_addend = static_cast<int32_t>(addend);
    if (signed_addend < 0) {
      PrintDetails("-");
      signed_addend = -signed_addend;
    } else {
      PrintDetails("+");
    }
    PrintDetails("%#x", signed_addend);
  }
  PrintDetails("\n");
  return Result::Ok;
}